

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

statusline checkprotoprefix(Curl_easy *data,connectdata *conn,char *s,size_t len)

{
  statusline sVar1;
  int iVar2;
  size_t max;
  
  if ((conn->handler->protocol & 0x40000) == 0) {
    sVar1 = checkhttpprefix(data,s,len);
    return sVar1;
  }
  max = 5;
  if (4 >= len) {
    max = len;
  }
  iVar2 = curl_strnequal("RTSP/",s,max);
  sVar1 = STATUS_BAD;
  if (iVar2 != 0) {
    sVar1 = (uint)(4 < len);
  }
  return sVar1;
}

Assistant:

static statusline
checkprotoprefix(struct Curl_easy *data, struct connectdata *conn,
                 const char *s, size_t len)
{
#ifndef CURL_DISABLE_RTSP
  if(conn->handler->protocol & CURLPROTO_RTSP)
    return checkrtspprefix(data, s, len);
#else
  (void)conn;
#endif /* CURL_DISABLE_RTSP */

  return checkhttpprefix(data, s, len);
}